

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  uint64_t uVar1;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  (this->suiteTimer).m_nanoseconds = uVar1;
  (this->stdOutForSuite)._M_string_length = 0;
  *(this->stdOutForSuite)._M_dataplus._M_p = '\0';
  (this->stdErrForSuite)._M_string_length = 0;
  *(this->stdErrForSuite)._M_dataplus._M_p = '\0';
  this->unexpectedExceptions = 0;
  return;
}

Assistant:

void JunitReporter::testGroupStarting(GroupInfo const &groupInfo) {
        suiteTimer.start();
        stdOutForSuite.clear();
        stdErrForSuite.clear();
        unexpectedExceptions = 0;
        CumulativeReporterBase::testGroupStarting(groupInfo);
    }